

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

bool __thiscall cmParseJacocoCoverage::ReadJacocoXML(cmParseJacocoCoverage *this,char *file)

{
  XMLParser parser;
  XMLParser XStack_a8;
  
  XMLParser::XMLParser(&XStack_a8,this->CTest,this->Coverage);
  cmXMLParser::ParseFile(&XStack_a8.super_cmXMLParser,file);
  XMLParser::~XMLParser(&XStack_a8);
  return true;
}

Assistant:

bool cmParseJacocoCoverage::ReadJacocoXML(const char* file)
{
  cmParseJacocoCoverage::XMLParser parser(this->CTest, this->Coverage);
  parser.ParseFile(file);
  return true;
}